

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::Shutdown(ImGuiContext *context)

{
  int *piVar1;
  ImFontAtlas *p;
  char *pcVar2;
  ImGuiContextHook *pIVar3;
  ImGuiWindow **ppIVar4;
  ImGuiColorMod *pIVar5;
  ImGuiStyleMod *pIVar6;
  ImFont **ppIVar7;
  ImGuiPopupData *pIVar8;
  ImGuiViewportP **ppIVar9;
  ImGuiPtrOrIndex *pIVar10;
  ImGuiShrinkWidthItem *pIVar11;
  uint *puVar12;
  ImGuiSettingsHandler *pIVar13;
  FILE *__stream;
  ImGuiContext *pIVar14;
  ImGuiContext *g;
  long lVar15;
  long lVar16;
  
  p = (context->IO).Fonts;
  if ((p != (ImFontAtlas *)0x0) && (context->FontAtlasOwnedByContext == true)) {
    p->Locked = false;
    IM_DELETE<ImFontAtlas>(p);
  }
  (context->IO).Fonts = (ImFontAtlas *)0x0;
  pIVar14 = GImGui;
  if (context->Initialized == true) {
    if ((context->SettingsLoaded == true) &&
       (pcVar2 = (context->IO).IniFilename, pcVar2 != (char *)0x0)) {
      GImGui = context;
      SaveIniSettingsToDisk(pcVar2);
    }
    GImGui = context;
    DestroyPlatformWindows();
    GImGui = pIVar14;
    DockContextShutdown(context);
    if (0 < (context->Hooks).Size) {
      lVar15 = 0;
      lVar16 = 0;
      do {
        pIVar3 = (context->Hooks).Data;
        if (*(int *)(pIVar3 + lVar15) == 6) {
          (**(code **)(pIVar3 + lVar15 + 8))(context,pIVar3 + lVar15);
        }
        lVar16 = lVar16 + 1;
        lVar15 = lVar15 + 0x18;
      } while (lVar16 < (context->Hooks).Size);
    }
    if (0 < (context->Windows).Size) {
      lVar15 = 0;
      do {
        IM_DELETE<ImGuiWindow>((context->Windows).Data[lVar15]);
        lVar15 = lVar15 + 1;
      } while (lVar15 < (context->Windows).Size);
    }
    ppIVar4 = (context->Windows).Data;
    if (ppIVar4 != (ImGuiWindow **)0x0) {
      (context->Windows).Size = 0;
      (context->Windows).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
      (context->Windows).Data = (ImGuiWindow **)0x0;
    }
    ppIVar4 = (context->WindowsFocusOrder).Data;
    if (ppIVar4 != (ImGuiWindow **)0x0) {
      (context->WindowsFocusOrder).Size = 0;
      (context->WindowsFocusOrder).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
      (context->WindowsFocusOrder).Data = (ImGuiWindow **)0x0;
    }
    ppIVar4 = (context->WindowsTempSortBuffer).Data;
    if (ppIVar4 != (ImGuiWindow **)0x0) {
      (context->WindowsTempSortBuffer).Size = 0;
      (context->WindowsTempSortBuffer).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
      (context->WindowsTempSortBuffer).Data = (ImGuiWindow **)0x0;
    }
    context->CurrentWindow = (ImGuiWindow *)0x0;
    ppIVar4 = (context->CurrentWindowStack).Data;
    if (ppIVar4 != (ImGuiWindow **)0x0) {
      (context->CurrentWindowStack).Size = 0;
      (context->CurrentWindowStack).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
      (context->CurrentWindowStack).Data = (ImGuiWindow **)0x0;
    }
    ImGuiStorage::Clear(&context->WindowsById);
    context->NavWindow = (ImGuiWindow *)0x0;
    context->ActiveIdPreviousFrameWindow = (ImGuiWindow *)0x0;
    context->ActiveIdWindow = (ImGuiWindow *)0x0;
    context->MovingWindow = (ImGuiWindow *)0x0;
    context->HoveredWindow = (ImGuiWindow *)0x0;
    context->HoveredRootWindow = (ImGuiWindow *)0x0;
    context->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
    pIVar5 = (context->ColorModifiers).Data;
    if (pIVar5 != (ImGuiColorMod *)0x0) {
      (context->ColorModifiers).Size = 0;
      (context->ColorModifiers).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
      (context->ColorModifiers).Data = (ImGuiColorMod *)0x0;
    }
    pIVar6 = (context->StyleModifiers).Data;
    if (pIVar6 != (ImGuiStyleMod *)0x0) {
      (context->StyleModifiers).Size = 0;
      (context->StyleModifiers).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
      (context->StyleModifiers).Data = (ImGuiStyleMod *)0x0;
    }
    ppIVar7 = (context->FontStack).Data;
    if (ppIVar7 != (ImFont **)0x0) {
      (context->FontStack).Size = 0;
      (context->FontStack).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar7,GImAllocatorUserData);
      (context->FontStack).Data = (ImFont **)0x0;
    }
    pIVar8 = (context->OpenPopupStack).Data;
    if (pIVar8 != (ImGuiPopupData *)0x0) {
      (context->OpenPopupStack).Size = 0;
      (context->OpenPopupStack).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar8,GImAllocatorUserData);
      (context->OpenPopupStack).Data = (ImGuiPopupData *)0x0;
    }
    pIVar8 = (context->BeginPopupStack).Data;
    if (pIVar8 != (ImGuiPopupData *)0x0) {
      (context->BeginPopupStack).Size = 0;
      (context->BeginPopupStack).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar8,GImAllocatorUserData);
      (context->BeginPopupStack).Data = (ImGuiPopupData *)0x0;
    }
    context->CurrentViewport = (ImGuiViewportP *)0x0;
    context->MouseViewport = (ImGuiViewportP *)0x0;
    context->MouseLastHoveredViewport = (ImGuiViewportP *)0x0;
    if (0 < (context->Viewports).Size) {
      lVar15 = 0;
      do {
        IM_DELETE<ImGuiViewportP>((context->Viewports).Data[lVar15]);
        lVar15 = lVar15 + 1;
      } while (lVar15 < (context->Viewports).Size);
    }
    ppIVar9 = (context->Viewports).Data;
    if (ppIVar9 != (ImGuiViewportP **)0x0) {
      (context->Viewports).Size = 0;
      (context->Viewports).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar9,GImAllocatorUserData);
      (context->Viewports).Data = (ImGuiViewportP **)0x0;
    }
    ImPool<ImGuiTabBar>::Clear(&context->TabBars);
    pIVar10 = (context->CurrentTabBarStack).Data;
    if (pIVar10 != (ImGuiPtrOrIndex *)0x0) {
      (context->CurrentTabBarStack).Size = 0;
      (context->CurrentTabBarStack).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar10,GImAllocatorUserData);
      (context->CurrentTabBarStack).Data = (ImGuiPtrOrIndex *)0x0;
    }
    pIVar11 = (context->ShrinkWidthBuffer).Data;
    if (pIVar11 != (ImGuiShrinkWidthItem *)0x0) {
      (context->ShrinkWidthBuffer).Size = 0;
      (context->ShrinkWidthBuffer).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar11,GImAllocatorUserData);
      (context->ShrinkWidthBuffer).Data = (ImGuiShrinkWidthItem *)0x0;
    }
    pcVar2 = (context->ClipboardHandlerData).Data;
    if (pcVar2 != (char *)0x0) {
      (context->ClipboardHandlerData).Size = 0;
      (context->ClipboardHandlerData).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pcVar2,GImAllocatorUserData);
      (context->ClipboardHandlerData).Data = (char *)0x0;
    }
    puVar12 = (context->MenusIdSubmittedThisFrame).Data;
    if (puVar12 != (uint *)0x0) {
      (context->MenusIdSubmittedThisFrame).Size = 0;
      (context->MenusIdSubmittedThisFrame).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar12,GImAllocatorUserData);
      (context->MenusIdSubmittedThisFrame).Data = (uint *)0x0;
    }
    ImGuiInputTextState::ClearFreeMemory(&context->InputTextState);
    ImChunkStream<ImGuiWindowSettings>::clear(&context->SettingsWindows);
    pIVar13 = (context->SettingsHandlers).Data;
    if (pIVar13 != (ImGuiSettingsHandler *)0x0) {
      (context->SettingsHandlers).Size = 0;
      (context->SettingsHandlers).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar13,GImAllocatorUserData);
      (context->SettingsHandlers).Data = (ImGuiSettingsHandler *)0x0;
    }
    __stream = (FILE *)context->LogFile;
    if (__stream != (FILE *)0x0) {
      if (__stream != _stdout) {
        fclose(__stream);
      }
      context->LogFile = (ImFileHandle)0x0;
    }
    ImGuiTextBuffer::clear(&context->LogBuffer);
    context->Initialized = false;
  }
  return;
}

Assistant:

void ImGui::Shutdown(ImGuiContext* context)
{
    // The fonts atlas can be used prior to calling NewFrame(), so we clear it even if g.Initialized is FALSE (which would happen if we never called NewFrame)
    ImGuiContext& g = *context;
    if (g.IO.Fonts && g.FontAtlasOwnedByContext)
    {
        g.IO.Fonts->Locked = false;
        IM_DELETE(g.IO.Fonts);
    }
    g.IO.Fonts = NULL;

    // Cleanup of other data are conditional on actually having initialized Dear ImGui.
    if (!g.Initialized)
        return;

    // Save settings (unless we haven't attempted to load them: CreateContext/DestroyContext without a call to NewFrame shouldn't save an empty file)
    if (g.SettingsLoaded && g.IO.IniFilename != NULL)
    {
        ImGuiContext* backup_context = GImGui;
        SetCurrentContext(&g);
        SaveIniSettingsToDisk(g.IO.IniFilename);
        SetCurrentContext(backup_context);
    }

    // Destroy platform windows
    ImGuiContext* backup_context = ImGui::GetCurrentContext();
    SetCurrentContext(context);
    DestroyPlatformWindows();
    SetCurrentContext(backup_context);

    // Shutdown extensions
    DockContextShutdown(&g);

    CallContextHooks(&g, ImGuiContextHookType_Shutdown);

    // Clear everything else
    for (int i = 0; i < g.Windows.Size; i++)
        IM_DELETE(g.Windows[i]);
    g.Windows.clear();
    g.WindowsFocusOrder.clear();
    g.WindowsTempSortBuffer.clear();
    g.CurrentWindow = NULL;
    g.CurrentWindowStack.clear();
    g.WindowsById.Clear();
    g.NavWindow = NULL;
    g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;
    g.ActiveIdWindow = g.ActiveIdPreviousFrameWindow = NULL;
    g.MovingWindow = NULL;
    g.ColorModifiers.clear();
    g.StyleModifiers.clear();
    g.FontStack.clear();
    g.OpenPopupStack.clear();
    g.BeginPopupStack.clear();

    g.CurrentViewport = g.MouseViewport = g.MouseLastHoveredViewport = NULL;
    for (int i = 0; i < g.Viewports.Size; i++)
        IM_DELETE(g.Viewports[i]);
    g.Viewports.clear();

    g.TabBars.Clear();
    g.CurrentTabBarStack.clear();
    g.ShrinkWidthBuffer.clear();

    g.ClipboardHandlerData.clear();
    g.MenusIdSubmittedThisFrame.clear();
    g.InputTextState.ClearFreeMemory();

    g.SettingsWindows.clear();
    g.SettingsHandlers.clear();

    if (g.LogFile)
    {
#ifndef IMGUI_DISABLE_TTY_FUNCTIONS
        if (g.LogFile != stdout)
#endif
            ImFileClose(g.LogFile);
        g.LogFile = NULL;
    }
    g.LogBuffer.clear();

    g.Initialized = false;
}